

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O3

FilterPolicy * leveldb::NewBloomFilterPolicy(int bits_per_key)

{
  long lVar1;
  FilterPolicy *pFVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  _func_int **pp_Var5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar2 = (FilterPolicy *)operator_new(0x18);
  pFVar2->_vptr_FilterPolicy = (_func_int **)&PTR__FilterPolicy_01397980;
  uVar4 = (ulong)((double)bits_per_key * 0.69);
  pFVar2[1]._vptr_FilterPolicy = (_func_int **)(long)bits_per_key;
  uVar4 = (long)((double)bits_per_key * 0.69 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  pp_Var5 = (_func_int **)(uVar4 + (uVar4 == 0));
  pp_Var3 = (_func_int **)0x1e;
  if (pp_Var5 < (_func_int **)0x1e) {
    pp_Var3 = pp_Var5;
  }
  pFVar2[2]._vptr_FilterPolicy = pp_Var3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pFVar2;
  }
  __stack_chk_fail();
}

Assistant:

const FilterPolicy* NewBloomFilterPolicy(int bits_per_key) {
  return new BloomFilterPolicy(bits_per_key);
}